

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

uint SOIL_direct_load_DDS(char *filename,uint reuse_texture_ID,int flags,int loading_as_cubemap)

{
  uint uVar1;
  FILE *__stream;
  size_t __size;
  uchar *buffer;
  size_t sVar2;
  
  if (filename == (char *)0x0) {
    result_string_pointer = "NULL filename";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      result_string_pointer = "Can not find DDS file";
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      fseek(__stream,0,0);
      buffer = (uchar *)malloc(__size);
      if (buffer != (uchar *)0x0) {
        sVar2 = fread(buffer,1,__size,__stream);
        fclose(__stream);
        if (sVar2 < __size) {
          __size = sVar2;
        }
        uVar1 = SOIL_direct_load_DDS_from_memory
                          (buffer,(int)__size,reuse_texture_ID,flags,loading_as_cubemap);
        free(buffer);
        return uVar1;
      }
      result_string_pointer = "malloc failed";
      fclose(__stream);
    }
  }
  return 0;
}

Assistant:

unsigned int SOIL_direct_load_DDS(
		const char *filename,
		unsigned int reuse_texture_ID,
		int flags,
		int loading_as_cubemap )
{
	FILE *f;
	unsigned char *buffer;
	size_t buffer_length, bytes_read;
	unsigned int tex_ID = 0;
	/*	error checks	*/
	if( NULL == filename )
	{
		result_string_pointer = "NULL filename";
		return 0;
	}
	f = fopen( filename, "rb" );
	if( NULL == f )
	{
		/*	the file doesn't seem to exist (or be open-able)	*/
		result_string_pointer = "Can not find DDS file";
		return 0;
	}
	fseek( f, 0, SEEK_END );
	buffer_length = ftell( f );
	fseek( f, 0, SEEK_SET );
	buffer = (unsigned char *) malloc( buffer_length );
	if( NULL == buffer )
	{
		result_string_pointer = "malloc failed";
		fclose( f );
		return 0;
	}
	bytes_read = fread( (void*)buffer, 1, buffer_length, f );
	fclose( f );
	if( bytes_read < buffer_length )
	{
		/*	huh?	*/
		buffer_length = bytes_read;
	}
	/*	now try to do the loading	*/
	tex_ID = SOIL_direct_load_DDS_from_memory(
		(const unsigned char *const)buffer, buffer_length,
		reuse_texture_ID, flags, loading_as_cubemap );
	SOIL_free_image_data( buffer );
	return tex_ID;
}